

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

void __thiscall dxil_spv::CFGStructurizer::build_reachability(CFGStructurizer *this)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  reference ppCVar4;
  CFGNode *node;
  iterator __end1;
  iterator __begin1;
  Vector<CFGNode_*> *__range1;
  CFGStructurizer *this_local;
  
  sVar3 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          size(&this->forward_post_visit_order);
  this->reachability_stride = (uint)(sVar3 + 0x1f >> 5);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::clear
            (&this->reachability_bitset);
  uVar1 = this->reachability_stride;
  sVar3 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          size(&this->forward_post_visit_order);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::resize
            (&this->reachability_bitset,uVar1 * sVar3);
  __end1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           begin(&this->forward_post_visit_order);
  node = (CFGNode *)
         std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::end
                   (&this->forward_post_visit_order);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                *)&node);
    if (!bVar2) break;
    ppCVar4 = __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator*(&__end1);
    visit_reachability(this,*ppCVar4);
    __gnu_cxx::
    __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void CFGStructurizer::build_reachability()
{
	reachability_stride = (forward_post_visit_order.size() + 31) / 32;
	reachability_bitset.clear();
	reachability_bitset.resize(reachability_stride * forward_post_visit_order.size());
	for (auto *node : forward_post_visit_order)
		visit_reachability(*node);
}